

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_schnorrsig_sign_internal
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_nonce_function_hardened noncefp,void *ndata)

{
  uchar *r32;
  uint uVar1;
  int iVar2;
  uint uVar3;
  code *pcVar4;
  void *pvVar5;
  char *pcVar6;
  uint flag;
  secp256k1_scalar local_220;
  secp256k1_scalar local_21c;
  uchar *local_218;
  size_t local_210;
  uchar *local_208;
  secp256k1_scalar e;
  uchar buf [32];
  uchar pk_buf [32];
  uchar local_1b8 [32];
  secp256k1_ge r;
  secp256k1_ge pk;
  secp256k1_gej rj;
  
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/modules/schnorrsig/main_impl.h"
            ,0x90,"test condition failed: ctx != NULL");
    abort();
  }
  if ((ctx->ecmult_gen_ctx).built == 0) {
    pvVar5 = (ctx->illegal_callback).data;
    pcVar6 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (sig64 == (uchar *)0x0) {
    pvVar5 = (ctx->illegal_callback).data;
    pcVar6 = "sig64 != NULL";
  }
  else if (msglen == 0 || msg != (uchar *)0x0) {
    if (keypair != (secp256k1_keypair *)0x0) {
      pcVar4 = nonce_function_bip340;
      if (noncefp != (secp256k1_nonce_function_hardened)0x0) {
        pcVar4 = noncefp;
      }
      local_218 = msg;
      local_210 = msglen;
      local_208 = sig64;
      uVar1 = secp256k1_keypair_load(ctx,&local_220,&pk,keypair);
      iVar2 = secp256k1_fe_is_odd(&pk.y);
      if (iVar2 != 0) {
        secp256k1_scalar_negate(&local_220,&local_220);
      }
      secp256k1_scalar_get_b32(local_1b8,&local_220);
      secp256k1_fe_get_b32(pk_buf,&pk.x);
      iVar2 = (*pcVar4)(buf,local_218,local_210,local_1b8,pk_buf,"BIP0340/nonce",0xd,ndata);
      if (iVar2 == 0) {
        uVar1 = 0;
      }
      secp256k1_scalar_set_b32(&local_21c,buf,(int *)0x0);
      uVar3 = secp256k1_scalar_is_zero(&local_21c);
      flag = ~uVar3 & uVar1 ^ 1;
      secp256k1_scalar_cmov(&local_21c,&secp256k1_scalar_one,flag);
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&rj,&local_21c);
      secp256k1_ge_set_gej(&r,&rj);
      secp256k1_declassify(ctx,&r,0x68);
      secp256k1_fe_normalize_var(&r.y);
      iVar2 = secp256k1_fe_is_odd(&r.y);
      if (iVar2 != 0) {
        secp256k1_scalar_negate(&local_21c,&local_21c);
      }
      secp256k1_fe_normalize_var(&r.x);
      r32 = local_208;
      secp256k1_fe_get_b32(local_208,&r.x);
      secp256k1_schnorrsig_challenge(&e,r32,local_218,local_210,pk_buf);
      secp256k1_scalar_mul(&e,&e,&local_220);
      secp256k1_scalar_add(&e,&e,&local_21c);
      secp256k1_scalar_get_b32(r32 + 0x20,&e);
      secp256k1_memczero(r32,0x40,flag);
      return ~uVar3 & uVar1;
    }
    pvVar5 = (ctx->illegal_callback).data;
    pcVar6 = "keypair != NULL";
  }
  else {
    pvVar5 = (ctx->illegal_callback).data;
    pcVar6 = "msg != NULL || msglen == 0";
  }
  (*(ctx->illegal_callback).fn)(pcVar6,pvVar5);
  return 0;
}

Assistant:

static int secp256k1_schnorrsig_sign_internal(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_nonce_function_hardened noncefp, void *ndata) {
    secp256k1_scalar sk;
    secp256k1_scalar e;
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_ge r;
    unsigned char buf[32] = { 0 };
    unsigned char pk_buf[32];
    unsigned char seckey[32];
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(keypair != NULL);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_bip340;
    }

    ret &= secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    /* Because we are signing for a x-only pubkey, the secret key is negated
     * before signing if the point corresponding to the secret key does not
     * have an even Y. */
    if (secp256k1_fe_is_odd(&pk.y)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    secp256k1_scalar_get_b32(seckey, &sk);
    secp256k1_fe_get_b32(pk_buf, &pk.x);
    ret &= !!noncefp(buf, msg, msglen, seckey, pk_buf, bip340_algo, sizeof(bip340_algo), ndata);
    secp256k1_scalar_set_b32(&k, buf, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);

    /* We declassify r to allow using it as a branch point. This is fine
     * because r is not a secret. */
    secp256k1_declassify(ctx, &r, sizeof(r));
    secp256k1_fe_normalize_var(&r.y);
    if (secp256k1_fe_is_odd(&r.y)) {
        secp256k1_scalar_negate(&k, &k);
    }
    secp256k1_fe_normalize_var(&r.x);
    secp256k1_fe_get_b32(&sig64[0], &r.x);

    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, pk_buf);
    secp256k1_scalar_mul(&e, &e, &sk);
    secp256k1_scalar_add(&e, &e, &k);
    secp256k1_scalar_get_b32(&sig64[32], &e);

    secp256k1_memczero(sig64, 64, !ret);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    memset(seckey, 0, sizeof(seckey));

    return ret;
}